

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  Fts3Table *p_00;
  bool bVar1;
  bool bVar2;
  Fts3PhraseToken *pFVar3;
  long lVar4;
  int local_60;
  bool local_59;
  Fts3MultiSegReader *pSegcsr;
  Fts3PhraseToken *pToken_1;
  int iCol;
  Fts3PhraseToken *pToken;
  int bIncrOk;
  int bHaveIncr;
  int i;
  int rc;
  Fts3Table *pTab;
  Fts3Phrase *p_local;
  int bOptOk_local;
  Fts3Cursor *pCsr_local;
  
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  bHaveIncr = 0;
  bVar2 = false;
  local_59 = false;
  if (((bOptOk != 0) && (local_59 = false, pCsr->bDesc == p_00->bDescIdx)) &&
     (local_59 = false, p->nToken < 5)) {
    local_59 = 0 < p->nToken;
  }
  bIncrOk = 0;
  while( true ) {
    bVar1 = false;
    if (local_59) {
      bVar1 = bIncrOk < p->nToken;
    }
    if (!bVar1) break;
    lVar4 = (long)bIncrOk;
    if ((p->aToken[lVar4].bFirst != 0) ||
       ((p->aToken[lVar4].pSegcsr != (Fts3MultiSegReader *)0x0 &&
        ((p->aToken[lVar4].pSegcsr)->bLookup == 0)))) {
      local_59 = false;
    }
    if (p->aToken[lVar4].pSegcsr != (Fts3MultiSegReader *)0x0) {
      bVar2 = true;
    }
    bIncrOk = bIncrOk + 1;
  }
  if ((local_59) && (bVar2)) {
    if (p->iColumn < p_00->nColumn) {
      local_60 = p->iColumn;
    }
    else {
      local_60 = -1;
    }
    bIncrOk = 0;
    while( true ) {
      bVar2 = false;
      if (bHaveIncr == 0) {
        bVar2 = bIncrOk < p->nToken;
      }
      if (!bVar2) break;
      pFVar3 = p->aToken + bIncrOk;
      if (pFVar3->pSegcsr != (Fts3MultiSegReader *)0x0) {
        bHaveIncr = sqlite3Fts3MsrIncrStart(p_00,pFVar3->pSegcsr,local_60,pFVar3->z,pFVar3->n);
      }
      bIncrOk = bIncrOk + 1;
    }
    p->bIncr = 1;
  }
  else {
    bHaveIncr = fts3EvalPhraseLoad(pCsr,p);
    p->bIncr = 0;
  }
  return bHaveIncr;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of 
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk 
   && pCsr->bDesc==pTab->bDescIdx 
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#ifdef SQLITE_TEST
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}